

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpf_reader.cpp
# Opt level: O2

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
RPF_reader::load_rpf
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,RPF_reader *this,
          string *file_to_read)

{
  pointer *ppPVar1;
  int *__lhs;
  bool bVar2;
  istream *piVar3;
  ostream *poVar4;
  long lVar5;
  stringstream local_520 [8];
  stringstream ss;
  ostream local_510 [376];
  long local_398;
  ifstream inFile;
  byte abStack_378 [488];
  undefined1 local_190 [8];
  Mirror incomming_mirror;
  string line;
  Point_d m_position;
  Point_d sample_position;
  string keyword;
  Point_d displayed_sample;
  vector<Point_d,_std::allocator<Point_d>_> sampled_positions;
  int local_48;
  int local_44;
  int id;
  int sample_amount;
  undefined4 local_34;
  
  std::ifstream::ifstream(&local_398);
  incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  displayed_sample.id = 0;
  displayed_sample._28_4_ = 0;
  _id = __return_storage_ptr__;
  Point_d::Point_d((Point_d *)((long)&line.field_2 + 8),999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)&m_position.id,999999.0,99999.0,99999.0,9999999);
  std::ifstream::open((string *)&local_398,(_Ios_Openmode)file_to_read);
  if ((abStack_378[*(long *)(local_398 + -0x18)] & 5) == 0) {
    ppPVar1 = &incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    __lhs = &sample_position.id;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_398,(string *)ppPVar1);
      lVar5 = *(long *)(*(long *)piVar3 + -0x18);
      if (((byte)piVar3[lVar5 + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_520);
      sample_position._24_8_ = &keyword._M_string_length;
      keyword._M_dataplus._M_p = (pointer)0x0;
      keyword._M_string_length._0_1_ = 0;
      std::operator<<(local_510,(string *)ppPVar1);
      std::operator>>((istream *)local_520,(string *)__lhs);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"m_id");
      if (bVar2) {
        std::istream::operator>>((istream *)local_520,&local_48);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"m_pos");
      if (bVar2) {
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
      }
      Point_d::Point_d((Point_d *)((long)&keyword.field_2 + 8),999999.0,99999.0,99999.0,9999999);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"dis_sample");
      local_34 = (undefined4)CONCAT71((int7)((ulong)lVar5 >> 8),1);
      if (bVar2) {
        std::istream::operator>>((istream *)local_520,(int *)&displayed_sample.dis);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        if (((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_) == 99999.0) &&
           (!NAN((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_)))) {
          local_34 = 0;
        }
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"sample_amount");
      if (bVar2) {
        std::istream::operator>>((istream *)local_520,&local_44);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"pos");
      if (bVar2) {
        std::istream::operator>>((istream *)local_520,(int *)&sample_position.dis);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::istream::_M_extract<double>((double *)local_520);
        std::vector<Point_d,_std::allocator<Point_d>_>::push_back
                  ((vector<Point_d,_std::allocator<Point_d>_> *)&displayed_sample.id,
                   (value_type *)&m_position.id);
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,"---");
      if (bVar2) {
        Mirror::Mirror((Mirror *)local_190);
        local_190._0_4_ = local_48;
        incomming_mirror._position._12_8_ = m_position._12_8_;
        incomming_mirror._0_8_ = line.field_2._8_8_;
        incomming_mirror._64_8_ = keyword.field_2._8_8_;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_44;
        std::vector<Point_d,_std::allocator<Point_d>_>::operator=
                  ((vector<Point_d,_std::allocator<Point_d>_> *)&incomming_mirror._position.id,
                   (vector<Point_d,_std::allocator<Point_d>_> *)&displayed_sample.id);
        incomming_mirror._displayed_sample.id._0_1_ = (undefined1)local_34;
        std::vector<Mirror,_std::allocator<Mirror>_>::push_back(_id,(Mirror *)local_190);
        Mirror::~Mirror((Mirror *)local_190);
      }
      std::__cxx11::string::~string((string *)__lhs);
      std::__cxx11::stringstream::~stringstream(local_520);
    }
    std::_Vector_base<Point_d,_std::allocator<Point_d>_>::~_Vector_base
              ((_Vector_base<Point_d,_std::allocator<Point_d>_> *)&displayed_sample.id);
    std::__cxx11::string::~string
              ((string *)
               &incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ifstream::~ifstream(&local_398);
    return _id;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Unable to open file ");
  std::operator<<(poVar4,(string *)file_to_read);
  exit(1);
}

Assistant:

std::vector<Mirror> RPF_reader::load_rpf(std::string const& file_to_read){
    std::ifstream inFile;
    std::string line;
    std::vector<Mirror> loadedMirrors;
    std::vector<Point_d> sampled_positions;
    Point_d m_position;
    Point_d sample_position;


    inFile.open(file_to_read);
    if (!inFile) {
        std::cerr << "Unable to open file "<<file_to_read;
        exit(1);   // call system to stop
    }
    else{
      while(std::getline(inFile, line)){

        std::stringstream ss;
        std::string keyword;


        //------------------------------------------------------
        //------------------------------------------------------
  /*
        int id;
        Point_d _position;
        std::vector<Point_d> _matching_samples;
        // value ammount of _matching_samples  not used???
        int _ammount_of_matching_samples = 0;
        Point_d _displayed_sample;
        bool has_sample = false;
        */
        //------------------------------------------------------
        //------------------------------------------------------

        ss << line;
        ss >> keyword;


        int id;

        if(keyword == "m_id"){
    //    std::cout <<"keyword: m_id " << '\n';
          ss >> id;

        }

        if(keyword == "m_pos"){
    //    std::cout <<"keyword: m_pos " << '\n';

          ss >> m_position.x;
          ss >> m_position.y;
          ss >> m_position.dis;

        }
        //std::cout <<"keyword: m_pos.y "<< m_position.y << '\n';


        Point_d displayed_sample;
        bool displayed = true;

        if(keyword == "dis_sample"){
    //      std::cout <<"keyword: displayed_sample " << '\n';

          ss >> displayed_sample.id;
          ss >> displayed_sample.x;
          ss >> displayed_sample.y;
          ss >> displayed_sample.dis;
          if(displayed_sample.dis == 99999){
            displayed = false;
          }
        }

        int sample_amount;

        if(keyword == "sample_amount"){
  //        std::cout <<"keyword: sample_ammount " << '\n';

          ss >> sample_amount;
        }

        if(keyword == "pos"){
    //      std::cout <<"keyword: pos " << '\n';


          ss >> sample_position.id;
          ss >> sample_position.x;
          ss >> sample_position.y;
          ss >> sample_position.dis;

          sampled_positions.push_back(sample_position);

        }

        if(keyword == "---"){
    //      std::cout <<"keyword: --- " << '\n';

          Mirror incomming_mirror;

          incomming_mirror.id = id;
          incomming_mirror._position = m_position;
          incomming_mirror._displayed_sample = displayed_sample;
          incomming_mirror._ammount_of_matching_samples = sample_amount;
          incomming_mirror._matching_samples = sampled_positions;
          incomming_mirror.has_sample = displayed;

          loadedMirrors.push_back(incomming_mirror);

        }
      }
    }
    return loadedMirrors;
  }